

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

OrderedStructurePatternMemberSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::OrderedStructurePatternMemberSyntax,slang::syntax::PatternSyntax&>
          (BumpAllocator *this,PatternSyntax *args)

{
  OrderedStructurePatternMemberSyntax *pOVar1;
  PatternSyntax *in_RDI;
  OrderedStructurePatternMemberSyntax *unaff_retaddr;
  
  pOVar1 = (OrderedStructurePatternMemberSyntax *)
           allocate((BumpAllocator *)args,(size_t)unaff_retaddr,(size_t)in_RDI);
  slang::syntax::OrderedStructurePatternMemberSyntax::OrderedStructurePatternMemberSyntax
            (unaff_retaddr,in_RDI);
  return pOVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }